

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# psftp.c
# Opt level: O3

wchar_t sftp_cmd_pwd(sftp_command *cmd)

{
  StripCtrlChars *sccpub;
  size_t sVar1;
  char *pcVar2;
  wchar_t wVar3;
  ptrlen str;
  
  sccpub = string_scc;
  pcVar2 = pwd;
  if (backend == (Backend *)0x0) {
    puts("psftp: not connected to a host; use \"open host.name\"");
    wVar3 = L'\0';
  }
  else {
    sVar1 = strlen(pwd);
    str.len = sVar1;
    str.ptr = pcVar2;
    pcVar2 = stripctrl_string_ptrlen(sccpub,str);
    wVar3 = L'\x01';
    if (pcVar2 != (char *)0x0) {
      printf("Remote directory is %s\n",pcVar2);
      safefree(pcVar2);
    }
  }
  return wVar3;
}

Assistant:

int sftp_cmd_pwd(struct sftp_command *cmd)
{
    if (!backend) {
        not_connected();
        return 0;
    }

    with_stripctrl(san, pwd)
        printf("Remote directory is %s\n", san);
    return 1;
}